

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O2

String * __thiscall
kj::str<capnp::Text::Builder,char_const(&)[3]>
          (String *__return_storage_ptr__,kj *this,Builder *params,char (*params_1) [3])

{
  ArrayPtr<const_char> local_30;
  undefined8 local_20;
  undefined8 uStack_18;
  
  local_20 = *(undefined8 *)(this + 8);
  uStack_18 = *(undefined8 *)(this + 0x10);
  local_30 = toCharSequence<char_const(&)[3]>((char (*) [3])params);
  _::concat<kj::StringPtr,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,(_ *)&local_20,(StringPtr *)&local_30,&local_30);
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}